

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall CGL::Matrix3x3::inv(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int i_1;
  long lVar10;
  double *pdVar11;
  int i;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  lVar10 = 0;
  lVar12 = 0;
  pdVar11 = (double *)__return_storage_ptr__;
  do {
    lVar13 = 0;
    do {
      uVar14 = 0x3ff0000000000000;
      if (lVar10 != lVar13) {
        uVar14 = 0;
      }
      *(undefined8 *)((long)pdVar11 + lVar13) = uVar14;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x48);
    lVar12 = lVar12 + 1;
    pdVar11 = pdVar11 + 1;
    lVar10 = lVar10 + 0x18;
  } while (lVar12 != 3);
  dVar1 = this->entries[2].y;
  dVar2 = this->entries[1].y;
  dVar3 = this->entries[1].z;
  dVar4 = this->entries[2].z;
  __return_storage_ptr__->entries[0].x = dVar2 * dVar4 - dVar1 * dVar3;
  dVar5 = this->entries[1].x;
  dVar6 = this->entries[2].x;
  __return_storage_ptr__->entries[1].x = dVar6 * dVar3 - dVar4 * dVar5;
  __return_storage_ptr__->entries[2].x = dVar1 * dVar5 - dVar6 * dVar2;
  dVar7 = this->entries[0].y;
  dVar8 = this->entries[0].z;
  __return_storage_ptr__->entries[0].y = dVar1 * dVar8 - dVar4 * dVar7;
  dVar9 = this->entries[0].x;
  __return_storage_ptr__->entries[1].y = dVar4 * dVar9 - dVar6 * dVar8;
  __return_storage_ptr__->entries[2].y = dVar6 * dVar7 - dVar1 * dVar9;
  __return_storage_ptr__->entries[0].z = dVar3 * dVar7 - dVar2 * dVar8;
  __return_storage_ptr__->entries[1].z = dVar8 * dVar5 - dVar3 * dVar9;
  __return_storage_ptr__->entries[2].z = dVar2 * dVar9 - dVar5 * dVar7;
  dVar1 = det(this);
  lVar10 = 0;
  pdVar11 = (double *)__return_storage_ptr__;
  do {
    lVar12 = 0;
    do {
      *(double *)((long)pdVar11 + lVar12) = *(double *)((long)pdVar11 + lVar12) * (1.0 / dVar1);
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x48);
    lVar10 = lVar10 + 1;
    pdVar11 = pdVar11 + 1;
  } while (lVar10 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::inv( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(1,2)*A(2,1) + A(1,1)*A(2,2); B(0,1) =  A(0,2)*A(2,1) - A(0,1)*A(2,2); B(0,2) = -A(0,2)*A(1,1) + A(0,1)*A(1,2);
    B(1,0) =  A(1,2)*A(2,0) - A(1,0)*A(2,2); B(1,1) = -A(0,2)*A(2,0) + A(0,0)*A(2,2); B(1,2) =  A(0,2)*A(1,0) - A(0,0)*A(1,2);
    B(2,0) = -A(1,1)*A(2,0) + A(1,0)*A(2,1); B(2,1) =  A(0,1)*A(2,0) - A(0,0)*A(2,1); B(2,2) = -A(0,1)*A(1,0) + A(0,0)*A(1,1);

    B /= det();

    return B;
  }